

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::clear
          (array<CEnvelope_*,_allocator_default<CEnvelope_*>_> *this)

{
  CEnvelope **ppCVar1;
  
  allocator_default<CEnvelope_*>::free_array(this->list);
  this->list_size = 1;
  ppCVar1 = (CEnvelope **)operator_new__(8);
  this->list = ppCVar1;
  this->num_elements = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}